

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMA_NV_Unmarshal(TPMA_NV *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPM_RC TVar2;
  TPMA_NV TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar2 = 0x9a;
  if (3 < iVar1) {
    TVar3 = (TPMA_NV)ByteArrayToUint32(*buffer);
    *target = TVar3;
    *buffer = *buffer + 4;
    TVar2 = 0xa1;
    if (((uint)TVar3 & 0x1f00300) == 0) {
      TVar2 = 0;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC UINT32_Unmarshal(UINT32 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 4) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT32(*buffer);
        *buffer += 4;
        result = TPM_RC_SUCCESS;
    }
    return result;
}